

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O0

int VP8SetError(VP8Decoder *dec,VP8StatusCode error,char *msg)

{
  char *msg_local;
  VP8StatusCode error_local;
  VP8Decoder *dec_local;
  
  if (dec->status_ == VP8_STATUS_OK) {
    dec->status_ = error;
    dec->error_msg_ = msg;
    dec->ready_ = 0;
  }
  return 0;
}

Assistant:

int VP8SetError(VP8Decoder* const dec,
                VP8StatusCode error, const char* const msg) {
  // VP8_STATUS_SUSPENDED is only meaningful in incremental decoding.
  assert(dec->incremental_ || error != VP8_STATUS_SUSPENDED);
  // The oldest error reported takes precedence over the new one.
  if (dec->status_ == VP8_STATUS_OK) {
    dec->status_ = error;
    dec->error_msg_ = msg;
    dec->ready_ = 0;
  }
  return 0;
}